

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LRNLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_lrn(NeuralNetworkLayer *this)

{
  bool bVar1;
  LRNLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_lrn(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_lrn(this);
    this_00 = (LRNLayerParams *)operator_new(0x28);
    LRNLayerParams::LRNLayerParams(this_00);
    (this->layer_).lrn_ = this_00;
  }
  return (LRNLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LRNLayerParams* NeuralNetworkLayer::mutable_lrn() {
  if (!has_lrn()) {
    clear_layer();
    set_has_lrn();
    layer_.lrn_ = new ::CoreML::Specification::LRNLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.lrn)
  return layer_.lrn_;
}